

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O3

void x1_010_alloc_rom(void *chip,UINT32 memsize)

{
  void *__s;
  x1_010_state *info;
  
  if (*(UINT32 *)((long)chip + 8) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)chip + 0x10),(ulong)memsize);
  *(void **)((long)chip + 0x10) = __s;
  *(UINT32 *)((long)chip + 8) = memsize;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void x1_010_alloc_rom(void* chip, UINT32 memsize)
{
	x1_010_state *info = (x1_010_state *)chip;
	
	if (info->ROMSize == memsize)
		return;
	
	info->rom = (UINT8*)realloc(info->rom, memsize);
	info->ROMSize = memsize;
	memset(info->rom, 0xFF, memsize);
	
	return;
}